

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  ApplicationFactory local_31;
  Application local_30;
  
  ApplicationFactory::make(&local_30,&local_31);
  solitaire::Application::run(&local_30);
  if ((_Tuple_impl<0UL,_solitaire::time::interfaces::FPSLimiter_*,_std::default_delete<solitaire::time::interfaces::FPSLimiter>_>
       )local_30.fpsLimiter._M_t.
        super___uniq_ptr_impl<solitaire::time::interfaces::FPSLimiter,_std::default_delete<solitaire::time::interfaces::FPSLimiter>_>
        ._M_t.
        super__Tuple_impl<0UL,_solitaire::time::interfaces::FPSLimiter_*,_std::default_delete<solitaire::time::interfaces::FPSLimiter>_>
        .super__Head_base<0UL,_solitaire::time::interfaces::FPSLimiter_*,_false>._M_head_impl !=
      (FPSLimiter *)0x0) {
    (**(code **)(*(long *)local_30.fpsLimiter._M_t.
                          super___uniq_ptr_impl<solitaire::time::interfaces::FPSLimiter,_std::default_delete<solitaire::time::interfaces::FPSLimiter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_solitaire::time::interfaces::FPSLimiter_*,_std::default_delete<solitaire::time::interfaces::FPSLimiter>_>
                          .super__Head_base<0UL,_solitaire::time::interfaces::FPSLimiter_*,_false>.
                          _M_head_impl + 8))();
  }
  local_30.fpsLimiter._M_t.
  super___uniq_ptr_impl<solitaire::time::interfaces::FPSLimiter,_std::default_delete<solitaire::time::interfaces::FPSLimiter>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::time::interfaces::FPSLimiter_*,_std::default_delete<solitaire::time::interfaces::FPSLimiter>_>
  .super__Head_base<0UL,_solitaire::time::interfaces::FPSLimiter_*,_false>._M_head_impl =
       (__uniq_ptr_data<solitaire::time::interfaces::FPSLimiter,_std::default_delete<solitaire::time::interfaces::FPSLimiter>,_true,_true>
        )(__uniq_ptr_impl<solitaire::time::interfaces::FPSLimiter,_std::default_delete<solitaire::time::interfaces::FPSLimiter>_>
          )0x0;
  if ((_Head_base<0UL,_solitaire::graphics::interfaces::Renderer_*,_false>)
      local_30.renderer._M_t.
      super___uniq_ptr_impl<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::graphics::interfaces::Renderer_*,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
      .super__Head_base<0UL,_solitaire::graphics::interfaces::Renderer_*,_false>._M_head_impl !=
      (_Head_base<0UL,_solitaire::graphics::interfaces::Renderer_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_30.renderer._M_t.
        super___uniq_ptr_impl<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
        ._M_t.
        super__Tuple_impl<0UL,_solitaire::graphics::interfaces::Renderer_*,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
        .super__Head_base<0UL,_solitaire::graphics::interfaces::Renderer_*,_false>._M_head_impl)[1])
              ();
  }
  local_30.renderer._M_t.
  super___uniq_ptr_impl<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::graphics::interfaces::Renderer_*,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
  .super__Head_base<0UL,_solitaire::graphics::interfaces::Renderer_*,_false>._M_head_impl =
       (__uniq_ptr_data<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>,_true,_true>
        )(__uniq_ptr_impl<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
          )0x0;
  if (local_30.eventsProcessor._M_t.
      super___uniq_ptr_impl<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::events::interfaces::EventsProcessor_*,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
      .super__Head_base<0UL,_solitaire::events::interfaces::EventsProcessor_*,_false>._M_head_impl
      != (__uniq_ptr_impl<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
          )0x0) {
    (**(code **)(*(long *)local_30.eventsProcessor._M_t.
                          super___uniq_ptr_impl<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_solitaire::events::interfaces::EventsProcessor_*,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
                          .
                          super__Head_base<0UL,_solitaire::events::interfaces::EventsProcessor_*,_false>
                          ._M_head_impl + 8))();
  }
  local_30.eventsProcessor._M_t.
  super___uniq_ptr_impl<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::events::interfaces::EventsProcessor_*,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
  .super__Head_base<0UL,_solitaire::events::interfaces::EventsProcessor_*,_false>._M_head_impl =
       (__uniq_ptr_data<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>,_true,_true>
        )(__uniq_ptr_impl<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
          )0x0;
  if (local_30.context._M_t.
      super___uniq_ptr_impl<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::interfaces::Context_*,_std::default_delete<solitaire::interfaces::Context>_>
      .super__Head_base<0UL,_solitaire::interfaces::Context_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
       )0x0) {
    (*(*(_func_int ***)
        local_30.context._M_t.
        super___uniq_ptr_impl<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
        ._M_t.
        super__Tuple_impl<0UL,_solitaire::interfaces::Context_*,_std::default_delete<solitaire::interfaces::Context>_>
        .super__Head_base<0UL,_solitaire::interfaces::Context_*,_false>._M_head_impl)[1])();
  }
  return 0;
}

Assistant:

int main(int, char**) try {
    ApplicationFactory {}.make().run();
    return 0;
}
catch (const std::runtime_error& e) {
    std::cout << e.what() << std::endl;
    return -1;
}